

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skeleton.cpp
# Opt level: O0

Joint * __thiscall
CMU462::DynamicScene::Skeleton::loadJoint
          (Skeleton *this,XMLElement *jointNode,
          set<double,_std::less<double>,_std::allocator<double>_> *knotTimes)

{
  SceneObject *pSVar1;
  ostream *this_00;
  Skeleton *this_01;
  pointer ppJVar2;
  double dVar3;
  double dVar4;
  pair<std::_Rb_tree_const_iterator<double>,_bool> pVar5;
  Joint *local_180;
  Joint *childJoint;
  XMLElement *pChild;
  undefined1 local_168;
  Vector3D local_160;
  undefined1 local_148 [8];
  Vector3D scale;
  double z_2;
  double y_2;
  double x_2;
  double time_2;
  undefined1 local_108;
  Vector3D local_100;
  undefined1 local_e8 [8];
  Vector3D rotation;
  double z_1;
  double y_1;
  double x_1;
  double time_1;
  undefined1 local_a8;
  Vector3D local_a0;
  undefined1 local_88 [8];
  Vector3D position;
  double z;
  double y;
  double x;
  double time;
  XMLElement *pListElement;
  XMLElement *pElement;
  Skeleton *local_30;
  Joint *joint;
  set<double,_std::less<double>,_std::allocator<double>_> *knotTimes_local;
  XMLElement *jointNode_local;
  Skeleton *this_local;
  
  joint = (Joint *)knotTimes;
  knotTimes_local = (set<double,_std::less<double>,_std::allocator<double>_> *)jointNode;
  jointNode_local = (XMLElement *)this;
  if (jointNode == (XMLElement *)0x0) {
    this_00 = std::operator<<((ostream *)&std::cout,"Invalid joint node");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    this_local = (Skeleton *)0x0;
  }
  else {
    this_01 = (Skeleton *)operator_new(0x160);
    Joint::Joint((Joint *)this_01,this);
    local_30 = this_01;
    pListElement = tinyxml2::XMLNode::FirstChildElement((XMLNode *)knotTimes_local,"Axis");
    ppJVar2 = (pointer)tinyxml2::XMLElement::DoubleAttribute(pListElement,"x");
    (local_30->joints).
    super__Vector_base<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppJVar2;
    ppJVar2 = (pointer)tinyxml2::XMLElement::DoubleAttribute(pListElement,"y");
    (local_30->joints).
    super__Vector_base<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = ppJVar2;
    dVar3 = tinyxml2::XMLElement::DoubleAttribute(pListElement,"z");
    (local_30->currentTransformation).entries[0].x = dVar3;
    pListElement = tinyxml2::XMLNode::FirstChildElement((XMLNode *)knotTimes_local,"RenderScale");
    dVar3 = tinyxml2::XMLElement::DoubleAttribute(pListElement,"val");
    (local_30->currentTransformation).entries[2].x = dVar3;
    pListElement = tinyxml2::XMLNode::FirstChildElement((XMLNode *)knotTimes_local,"CapsuleRadius");
    dVar3 = tinyxml2::XMLElement::DoubleAttribute(pListElement,"val");
    (local_30->currentTransformation).entries[1].w = dVar3;
    pListElement = tinyxml2::XMLNode::FirstChildElement((XMLNode *)knotTimes_local,"Positions");
    for (time = (double)tinyxml2::XMLNode::FirstChildElement(&pListElement->super_XMLNode,"Knot");
        time != 0.0; time = (double)tinyxml2::XMLNode::NextSiblingElement((XMLNode *)time,"Knot")) {
      x = tinyxml2::XMLElement::DoubleAttribute((XMLElement *)time,"Time");
      dVar3 = tinyxml2::XMLElement::DoubleAttribute((XMLElement *)time,"x");
      dVar4 = tinyxml2::XMLElement::DoubleAttribute((XMLElement *)time,"y");
      position.z = tinyxml2::XMLElement::DoubleAttribute((XMLElement *)time,"z");
      Vector3D::Vector3D((Vector3D *)local_88,dVar3,dVar4,position.z);
      dVar3 = x;
      pSVar1 = &local_30->super_SceneObject;
      Vector3D::Vector3D(&local_a0,(Vector3D *)local_88);
      Spline<CMU462::Vector3D>::setValue(&pSVar1->positions,dVar3,&local_a0);
      pVar5 = std::set<double,_std::less<double>,_std::allocator<double>_>::insert
                        ((set<double,_std::less<double>,_std::allocator<double>_> *)joint,&x);
      time_1 = (double)pVar5.first._M_node;
      local_a8 = pVar5.second;
    }
    pListElement = tinyxml2::XMLNode::FirstChildElement((XMLNode *)knotTimes_local,"Rotations");
    for (time = (double)tinyxml2::XMLNode::FirstChildElement(&pListElement->super_XMLNode,"Knot");
        time != 0.0; time = (double)tinyxml2::XMLNode::NextSiblingElement((XMLNode *)time,"Knot")) {
      x_1 = tinyxml2::XMLElement::DoubleAttribute((XMLElement *)time,"Time");
      dVar3 = tinyxml2::XMLElement::DoubleAttribute((XMLElement *)time,"x");
      dVar4 = tinyxml2::XMLElement::DoubleAttribute((XMLElement *)time,"y");
      rotation.z = tinyxml2::XMLElement::DoubleAttribute((XMLElement *)time,"z");
      Vector3D::Vector3D((Vector3D *)local_e8,dVar3,dVar4,rotation.z);
      dVar3 = x_1;
      pSVar1 = &local_30->super_SceneObject;
      Vector3D::Vector3D(&local_100,(Vector3D *)local_e8);
      Spline<CMU462::Vector3D>::setValue(&pSVar1->rotations,dVar3,&local_100);
      pVar5 = std::set<double,_std::less<double>,_std::allocator<double>_>::insert
                        ((set<double,_std::less<double>,_std::allocator<double>_> *)joint,&x_1);
      time_2 = (double)pVar5.first._M_node;
      local_108 = pVar5.second;
    }
    pListElement = tinyxml2::XMLNode::FirstChildElement((XMLNode *)knotTimes_local,"Scales");
    for (time = (double)tinyxml2::XMLNode::FirstChildElement(&pListElement->super_XMLNode,"Knot");
        time != 0.0; time = (double)tinyxml2::XMLNode::NextSiblingElement((XMLNode *)time,"Knot")) {
      x_2 = tinyxml2::XMLElement::DoubleAttribute((XMLElement *)time,"Time");
      dVar3 = tinyxml2::XMLElement::DoubleAttribute((XMLElement *)time,"x");
      dVar4 = tinyxml2::XMLElement::DoubleAttribute((XMLElement *)time,"y");
      scale.z = tinyxml2::XMLElement::DoubleAttribute((XMLElement *)time,"z");
      Vector3D::Vector3D((Vector3D *)local_148,dVar3,dVar4,scale.z);
      dVar3 = x_2;
      pSVar1 = &local_30->super_SceneObject;
      Vector3D::Vector3D(&local_160,(Vector3D *)local_148);
      Spline<CMU462::Vector3D>::setValue(&pSVar1->scales,dVar3,&local_160);
      pVar5 = std::set<double,_std::less<double>,_std::allocator<double>_>::insert
                        ((set<double,_std::less<double>,_std::allocator<double>_> *)joint,&x_2);
      pChild = (XMLElement *)pVar5.first._M_node;
      local_168 = pVar5.second;
    }
    pListElement = tinyxml2::XMLNode::FirstChildElement((XMLNode *)knotTimes_local,"Children");
    for (childJoint = (Joint *)tinyxml2::XMLNode::FirstChildElement
                                         (&pListElement->super_XMLNode,"Joint");
        childJoint != (Joint *)0x0;
        childJoint = (Joint *)tinyxml2::XMLNode::NextSiblingElement((XMLNode *)childJoint,"Joint"))
    {
      local_180 = loadJoint(this,(XMLElement *)childJoint,
                            (set<double,_std::less<double>,_std::allocator<double>_> *)joint);
      local_180->parent = (Joint *)local_30;
      std::vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>::
      push_back((vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>
                 *)&local_30->mesh,&local_180);
    }
    std::vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>::
    push_back(&this->joints,(value_type *)&local_30);
    this_local = local_30;
  }
  return (Joint *)this_local;
}

Assistant:

Joint* CMU462::DynamicScene::Skeleton::loadJoint(XMLElement * jointNode, set<double> &knotTimes)
   {
     if (jointNode == nullptr)
     {
       cout << "Invalid joint node" << endl;
       return nullptr;
     }
     Joint* joint = new Joint(this);

     XMLElement* pElement = jointNode->FirstChildElement("Axis");
     joint->axis.x = pElement->DoubleAttribute("x");
     joint->axis.y = pElement->DoubleAttribute("y");
     joint->axis.z = pElement->DoubleAttribute("z");

     pElement = jointNode->FirstChildElement("RenderScale");
     joint->renderScale = pElement->DoubleAttribute("val");

     pElement = jointNode->FirstChildElement("CapsuleRadius");
     joint->capsuleRadius = pElement->DoubleAttribute("val");

     // positions
     pElement = jointNode->FirstChildElement("Positions");
     XMLElement * pListElement = pElement->FirstChildElement("Knot");
     while (pListElement != nullptr)
     {
       double time = pListElement->DoubleAttribute("Time");
       double x = pListElement->DoubleAttribute("x");
       double y = pListElement->DoubleAttribute("y");
       double z = pListElement->DoubleAttribute("z");
       Vector3D position(x, y, z);

       joint->positions.setValue(time, position);
       knotTimes.insert(time);
       pListElement = pListElement->NextSiblingElement("Knot");
     }
     
     // rotations
     pElement = jointNode->FirstChildElement("Rotations");
     pListElement = pElement->FirstChildElement("Knot");
     while (pListElement != nullptr)
     {
       double time = pListElement->DoubleAttribute("Time");
       double x = pListElement->DoubleAttribute("x");
       double y = pListElement->DoubleAttribute("y");
       double z = pListElement->DoubleAttribute("z");
       Vector3D rotation(x, y, z);

       joint->rotations.setValue(time, rotation);
       knotTimes.insert(time);
       pListElement = pListElement->NextSiblingElement("Knot");
     }

     // scales
     pElement = jointNode->FirstChildElement("Scales");
     pListElement = pElement->FirstChildElement("Knot");
     while (pListElement != nullptr)
     {
       double time = pListElement->DoubleAttribute("Time");
       double x = pListElement->DoubleAttribute("x");
       double y = pListElement->DoubleAttribute("y");
       double z = pListElement->DoubleAttribute("z");
       Vector3D scale(x, y, z);

       joint->scales.setValue(time, scale);
       knotTimes.insert(time);
       pListElement = pListElement->NextSiblingElement("Knot");
     }

     pElement = jointNode->FirstChildElement("Children");
     XMLElement* pChild = pElement->FirstChildElement("Joint");
     while (pChild != nullptr)
     {
       Joint* childJoint = loadJoint(pChild, knotTimes);
       childJoint->parent = joint;
       joint->kids.push_back(childJoint);
       pChild = pChild->NextSiblingElement("Joint");
     }

     joints.push_back(joint);

     return joint;
   }